

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationY.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CRotationY<std::complex<double>_>::CRotationY
          (CRotationY<std::complex<double>_> *this)

{
  QRotationGate1<std::complex<double>_> *this_00;
  
  (this->super_QControlledGate2<std::complex<double>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<double>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00526220;
  this_00 = (QRotationGate1<std::complex<double>_> *)operator_new(0x20);
  QRotationGate1<std::complex<double>_>::QRotationGate1(this_00,1,0.0,false);
  (this_00->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
       (QObject<std::complex<double>_>)&PTR_nbQubits_00521598;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::RotationY<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationY<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::RotationY<std::complex<double>_>_*,_std::default_delete<qclab::qgates::RotationY<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::RotationY<std::complex<double>_>_*,_false>._M_head_impl =
       (RotationY<std::complex<double>_> *)this_00;
  return;
}

Assistant:

CRotationY()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< RotationY< T > >( 1 , 0. ) )
        { }